

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O3

void ggml_backend_cpu_device_get_props(ggml_backend_dev_t dev,ggml_backend_dev_props *props)

{
  props->name = "CPU";
  props->description = *dev->context;
  props->memory_free = 0;
  props->memory_total = 0;
  *(undefined8 *)((long)&props->memory_total + 6) = 0;
  (props->caps).buffer_from_host_ptr = true;
  (props->caps).events = false;
  return;
}

Assistant:

static void ggml_backend_cpu_device_get_props(ggml_backend_dev_t dev, struct ggml_backend_dev_props * props) {
    props->name        = ggml_backend_cpu_device_get_name(dev);
    props->description = ggml_backend_cpu_device_get_description(dev);
    props->type        = ggml_backend_cpu_device_get_type(dev);
    ggml_backend_cpu_device_get_memory(dev, &props->memory_free, &props->memory_total);
    props->caps = {
        /* .async                 = */ false,
        /* .host_buffer           = */ false,
        /* .buffer_from_host_ptr  = */ true,
        /* .events                = */ false,
    };
}